

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStep_FullRHS(void *arkode_mem,realtype t,N_Vector y,N_Vector f,int mode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  N_Vector in_RDX;
  N_Vector in_RSI;
  ARKodeMem in_XMM0_Qa;
  N_Vector *Xvecs;
  realtype *cvals;
  int recomputeRHS;
  int retval;
  int nvec;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  N_Vector *X;
  void *in_stack_ffffffffffffffa8;
  N_Vector x;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int local_44;
  ARKodeARKStepMem local_40;
  ARKodeMem local_38;
  int local_2c;
  N_Vector local_28;
  N_Vector local_20;
  ARKodeMem local_18;
  int local_4;
  
  local_2c = in_ECX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_XMM0_Qa;
  local_4 = arkStep_AccessStepMem
                      (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                       (ARKodeMem *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       (ARKodeARKStepMem *)0x1128968);
  if (local_4 == 0) {
    x = (N_Vector)local_40->cvals;
    X = local_40->Xvecs;
    if (((local_40->mass_type == 2) && (local_40->msetup != (ARKMassSetupFn)0x0)) &&
       (iVar1 = (*local_40->msetup)(local_38,(realtype)local_18,local_28,local_38->tempv2,
                                    local_38->tempv3), iVar1 != 0)) {
      local_4 = -0xf;
    }
    else {
      if (local_2c == 0) {
        iVar1 = local_2c;
        if (local_40->explicit != 0) {
          iVar1 = (*local_40->fe)((realtype)local_18,local_20,*local_40->Fe,local_38->user_data);
          local_40->nfe = local_40->nfe + 1;
          if (iVar1 != 0) {
            arkProcessError(local_18,(int)local_38,(char *)0xfffffff8,"ARKode::ARKStep",
                            "arkStep_FullRHS",
                            "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                           );
            return -8;
          }
          iVar1 = local_2c;
          if (local_40->expforcing != 0) {
            x->content = (void *)0x3ff0000000000000;
            *X = *local_40->Fe;
            local_44 = 1;
            arkStep_ApplyForcing(local_40,(realtype)local_18,1.0,&local_44);
            N_VLinearCombination
                      (in_stack_ffffffffffffffb4,(realtype *)x,X,
                       (N_Vector)CONCAT44(local_2c,in_stack_ffffffffffffff98));
            iVar1 = local_2c;
          }
        }
        if (local_40->implicit != 0) {
          iVar3 = (*local_40->fi)((realtype)local_18,local_20,*local_40->Fi,local_38->user_data);
          local_40->nfi = local_40->nfi + 1;
          if (iVar3 != 0) {
            arkProcessError(local_18,(int)local_38,(char *)0xfffffff8,"ARKode::ARKStep",
                            "arkStep_FullRHS",
                            "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                           );
            return -8;
          }
          if (local_40->impforcing != 0) {
            x->content = (void *)0x3ff0000000000000;
            *X = *local_40->Fi;
            local_44 = 1;
            arkStep_ApplyForcing(local_40,(realtype)local_18,1.0,&local_44);
            N_VLinearCombination
                      (in_stack_ffffffffffffffb4,(realtype *)x,X,
                       (N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffff98));
          }
        }
        if ((local_40->explicit == 0) || (local_40->implicit == 0)) {
          if (local_40->implicit == 0) {
            N_VScale((realtype)X,(N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffff98),
                     (N_Vector)0x1128ce7);
          }
          else {
            N_VScale((realtype)X,(N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffff98),
                     (N_Vector)0x1128cc7);
          }
        }
        else {
          N_VLinearSum((realtype)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),x,
                       (realtype)X,(N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffff98),
                       (N_Vector)0x1128c9c);
        }
      }
      else if (local_2c == 1) {
        iVar1 = 0;
        if ((local_40->explicit != 0) && (1e-10 < ABS(local_40->Be->c[local_40->stages + -1] - 1.0))
           ) {
          iVar1 = 1;
        }
        if ((local_40->implicit != 0) && (1e-10 < ABS(local_40->Bi->c[local_40->stages + -1] - 1.0))
           ) {
          iVar1 = 1;
        }
        iVar3 = local_2c;
        if (iVar1 == 0) {
          if (local_40->explicit != 0) {
            N_VScale((realtype)X,(N_Vector)CONCAT44(1,in_stack_ffffffffffffff98),(N_Vector)0x1129010
                    );
            iVar3 = local_2c;
          }
          if (local_40->implicit != 0) {
            N_VScale((realtype)X,(N_Vector)CONCAT44(iVar3,in_stack_ffffffffffffff98),
                     (N_Vector)0x112904f);
          }
        }
        else {
          if (local_40->explicit != 0) {
            iVar3 = (*local_40->fe)((realtype)local_18,local_20,*local_40->Fe,local_38->user_data);
            local_40->nfe = local_40->nfe + 1;
            if (iVar3 != 0) {
              arkProcessError(local_18,(int)local_38,(char *)0xfffffff8,"ARKode::ARKStep",
                              "arkStep_FullRHS",
                              "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                             );
              return -8;
            }
            iVar3 = local_2c;
            if (local_40->expforcing != 0) {
              x->content = (void *)0x3ff0000000000000;
              *X = *local_40->Fe;
              local_44 = 1;
              arkStep_ApplyForcing(local_40,(realtype)local_18,1.0,&local_44);
              N_VLinearCombination
                        (iVar1,(realtype *)x,X,
                         (N_Vector)CONCAT44(local_2c,in_stack_ffffffffffffff98));
              iVar3 = local_2c;
            }
          }
          if (local_40->implicit != 0) {
            iVar2 = (*local_40->fi)((realtype)local_18,local_20,*local_40->Fi,local_38->user_data);
            local_40->nfi = local_40->nfi + 1;
            if (iVar2 != 0) {
              arkProcessError(local_18,(int)local_38,(char *)0xfffffff8,"ARKode::ARKStep",
                              "arkStep_FullRHS",
                              "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                             );
              return -8;
            }
            if (local_40->impforcing != 0) {
              x->content = (void *)0x3ff0000000000000;
              *X = *local_40->Fi;
              local_44 = 1;
              arkStep_ApplyForcing(local_40,(realtype)local_18,1.0,&local_44);
              N_VLinearCombination
                        (iVar1,(realtype *)x,X,(N_Vector)CONCAT44(iVar3,in_stack_ffffffffffffff98));
            }
          }
        }
        if ((local_40->explicit == 0) || (local_40->implicit == 0)) {
          if (local_40->implicit == 0) {
            N_VScale((realtype)X,(N_Vector)CONCAT44(iVar3,in_stack_ffffffffffffff98),
                     (N_Vector)0x11290df);
          }
          else {
            N_VScale((realtype)X,(N_Vector)CONCAT44(iVar3,in_stack_ffffffffffffff98),
                     (N_Vector)0x11290bf);
          }
        }
        else {
          N_VLinearSum((realtype)CONCAT44(iVar1,in_stack_ffffffffffffffb0),x,(realtype)X,
                       (N_Vector)CONCAT44(iVar3,in_stack_ffffffffffffff98),(N_Vector)0x1129094);
        }
      }
      else {
        if (local_2c != 2) {
          arkProcessError(local_38,-8,"ARKode::ARKStep","arkStep_FullRHS","Unknown full RHS mode");
          return -8;
        }
        iVar1 = local_2c;
        if (local_40->explicit != 0) {
          iVar1 = (*local_40->fe)((realtype)local_18,local_20,local_38->tempv2,local_38->user_data);
          local_40->nfe = local_40->nfe + 1;
          if (iVar1 != 0) {
            arkProcessError(local_18,(int)local_38,(char *)0xfffffff8,"ARKode::ARKStep",
                            "arkStep_FullRHS",
                            "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                           );
            return -8;
          }
          iVar1 = local_2c;
          if (local_40->expforcing != 0) {
            x->content = (void *)0x3ff0000000000000;
            *X = local_38->tempv2;
            local_44 = 1;
            arkStep_ApplyForcing(local_40,(realtype)local_18,1.0,&local_44);
            N_VLinearCombination
                      (in_stack_ffffffffffffffb4,(realtype *)x,X,
                       (N_Vector)CONCAT44(local_2c,in_stack_ffffffffffffff98));
            iVar1 = local_2c;
          }
        }
        if (local_40->implicit != 0) {
          iVar3 = (*local_40->fi)((realtype)local_18,local_20,local_40->sdata,local_38->user_data);
          local_40->nfi = local_40->nfi + 1;
          if (iVar3 != 0) {
            arkProcessError(local_18,(int)local_38,(char *)0xfffffff8,"ARKode::ARKStep",
                            "arkStep_FullRHS",
                            "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                           );
            return -8;
          }
          if (local_40->impforcing != 0) {
            x->content = (void *)0x3ff0000000000000;
            *X = local_40->sdata;
            local_44 = 1;
            arkStep_ApplyForcing(local_40,(realtype)local_18,1.0,&local_44);
            N_VLinearCombination
                      (in_stack_ffffffffffffffb4,(realtype *)x,X,
                       (N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffff98));
          }
        }
        if ((local_40->explicit == 0) || (local_40->implicit == 0)) {
          if (local_40->implicit == 0) {
            N_VScale((realtype)X,(N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffff98),
                     (N_Vector)0x1129380);
          }
          else {
            N_VScale((realtype)X,(N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffff98),
                     (N_Vector)0x1129360);
          }
        }
        else {
          N_VLinearSum((realtype)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),x,
                       (realtype)X,(N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffff98),
                       (N_Vector)0x1129338);
        }
      }
      if ((local_40->mass_type == 0) ||
         (iVar1 = (*local_40->msolve)(local_38,local_28,local_40->nlscoef / local_38->h), iVar1 == 0
         )) {
        local_4 = 0;
      }
      else {
        arkProcessError(local_38,-0x10,"ARKode::ARKStep","arkStep_FullRHS",
                        "Mass matrix solver failure");
        local_4 = -0x10;
      }
    }
  }
  return local_4;
}

Assistant:

int arkStep_FullRHS(void* arkode_mem, realtype t, N_Vector y, N_Vector f,
                    int mode)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int nvec, retval;
  booleantype recomputeRHS;
  realtype* cvals;
  N_Vector* Xvecs;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "arkStep_FullRHS",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* local shortcuts for use with fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* setup mass-matrix if required (use output f as a temporary) */
  if ((step_mem->mass_type == MASS_TIMEDEP) && (step_mem->msetup != NULL)) {
    retval = step_mem->msetup((void *) ark_mem, t, f,
                              ark_mem->tempv2, ark_mem->tempv3);
    if (retval != ARK_SUCCESS)  return(ARK_MASSSETUP_FAIL);
  }

  /* perform RHS functions contingent on 'mode' argument */
  switch(mode) {

  /* ARK_FULLRHS_START: called at the beginning of a simulation
     Store the vectors fe(t,y) and fi(t,y) in Fe[0] and Fi[0] for
     possible reuse in the first stage of the subsequent time step */
  case ARK_FULLRHS_START:

    /* call fe if the problem has an explicit component */
    if (step_mem->explicit) {
      retval = step_mem->fe(t, y, step_mem->Fe[0], ark_mem->user_data);
      step_mem->nfe++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::ARKStep",
                        "arkStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }
      /* apply external polynomial forcing */
      if (step_mem->expforcing) {
        cvals[0] = ONE;
        Xvecs[0] = step_mem->Fe[0];
        nvec     = 1;
        arkStep_ApplyForcing(step_mem, t, ONE, &nvec);
        N_VLinearCombination(nvec, cvals, Xvecs, step_mem->Fe[0]);
      }
    }

    /* call fi if the problem has an implicit component */
    if (step_mem->implicit) {
      retval = step_mem->fi(t, y, step_mem->Fi[0], ark_mem->user_data);
      step_mem->nfi++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::ARKStep",
                        "arkStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }
      /* apply external polynomial forcing */
      if (step_mem->impforcing) {
        cvals[0] = ONE;
        Xvecs[0] = step_mem->Fi[0];
        nvec     = 1;
        arkStep_ApplyForcing(step_mem, t, ONE, &nvec);
        N_VLinearCombination(nvec, cvals, Xvecs, step_mem->Fi[0]);
      }
    }

    /* combine RHS vector(s) into output */
    if (step_mem->explicit && step_mem->implicit) { /* ImEx */
      N_VLinearSum(ONE, step_mem->Fi[0], ONE, step_mem->Fe[0], f);
    } else if (step_mem->implicit) {                   /* implicit */
      N_VScale(ONE, step_mem->Fi[0], f);
    } else {                                           /* explicit */
      N_VScale(ONE, step_mem->Fe[0], f);
    }

    break;


  /* ARK_FULLRHS_END: called at the end of a successful step
     If the ARK method coefficients support it, we just copy the last stage RHS
     vectors to fill f instead of calling fe() and fi().
     Copy the results to Fe[0] and Fi[0] if the ARK coefficients support it. */
  case ARK_FULLRHS_END:

    /* determine if explicit/implicit RHS functions need to be recomputed */
    recomputeRHS = SUNFALSE;
    if ( step_mem->explicit && (SUNRabs(step_mem->Be->c[step_mem->stages-1]-ONE)>TINY) )
      recomputeRHS = SUNTRUE;
    if ( step_mem->implicit && (SUNRabs(step_mem->Bi->c[step_mem->stages-1]-ONE)>TINY) )
      recomputeRHS = SUNTRUE;

    /* base RHS calls on recomputeRHS argument */
    if (recomputeRHS) {

      /* call fe if the problem has an explicit component */
      if (step_mem->explicit) {
        retval = step_mem->fe(t, y, step_mem->Fe[0], ark_mem->user_data);
        step_mem->nfe++;
        if (retval != 0) {
          arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::ARKStep",
                          "arkStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
          return(ARK_RHSFUNC_FAIL);
        }
        /* apply external polynomial forcing */
        if (step_mem->expforcing) {
          cvals[0] = ONE;
          Xvecs[0] = step_mem->Fe[0];
          nvec     = 1;
          arkStep_ApplyForcing(step_mem, t, ONE, &nvec);
          N_VLinearCombination(nvec, cvals, Xvecs, step_mem->Fe[0]);
        }
      }

      /* call fi if the problem has an implicit component */
      if (step_mem->implicit) {
        retval = step_mem->fi(t, y, step_mem->Fi[0], ark_mem->user_data);
        step_mem->nfi++;
        if (retval != 0) {
          arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::ARKStep",
                          "arkStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
          return(ARK_RHSFUNC_FAIL);
        }
        /* apply external polynomial forcing */
        if (step_mem->impforcing) {
          cvals[0] = ONE;
          Xvecs[0] = step_mem->Fi[0];
          nvec     = 1;
          arkStep_ApplyForcing(step_mem, t, ONE, &nvec);
          N_VLinearCombination(nvec, cvals, Xvecs, step_mem->Fi[0]);
        }
      }
    } else {
      if (step_mem->explicit)
        N_VScale(ONE, step_mem->Fe[step_mem->stages-1], step_mem->Fe[0]);
      if (step_mem->implicit)
        N_VScale(ONE, step_mem->Fi[step_mem->stages-1], step_mem->Fi[0]);
    }

    /* combine RHS vector(s) into output */
    if (step_mem->explicit && step_mem->implicit) { /* ImEx */
      N_VLinearSum(ONE, step_mem->Fi[0], ONE, step_mem->Fe[0], f);
    } else if (step_mem->implicit) {                   /* implicit */
      N_VScale(ONE, step_mem->Fi[0], f);
    } else {                                           /* explicit */
      N_VScale(ONE, step_mem->Fe[0], f);
    }

    break;

  /* ARK_FULLRHS_OTHER: called for dense output in-between steps or for
     estimation of the initial time step size, store the intermediate
     calculations in such a way as to not interfere with the other two modes */
  case ARK_FULLRHS_OTHER:

    /* call fe if the problem has an explicit component (store in ark_tempv2) */
    if (step_mem->explicit) {
      retval = step_mem->fe(t, y, ark_mem->tempv2, ark_mem->user_data);
      step_mem->nfe++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::ARKStep",
                        "arkStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }
      /* apply external polynomial forcing */
      if (step_mem->expforcing) {
        cvals[0] = ONE;
        Xvecs[0] = ark_mem->tempv2;
        nvec     = 1;
        arkStep_ApplyForcing(step_mem, t, ONE, &nvec);
        N_VLinearCombination(nvec, cvals, Xvecs, ark_mem->tempv2);
      }
    }

    /* call fi if the problem has an implicit component (store in sdata) */
    if (step_mem->implicit) {
      retval = step_mem->fi(t, y, step_mem->sdata, ark_mem->user_data);
      step_mem->nfi++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::ARKStep",
                        "arkStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }
      /* apply external polynomial forcing */
      if (step_mem->impforcing) {
        cvals[0] = ONE;
        Xvecs[0] = step_mem->sdata;
        nvec     = 1;
        arkStep_ApplyForcing(step_mem, t, ONE, &nvec);
        N_VLinearCombination(nvec, cvals, Xvecs, step_mem->sdata);
      }
    }

    /* combine RHS vector(s) into output */
    if (step_mem->explicit && step_mem->implicit) { /* ImEx */
      N_VLinearSum(ONE, step_mem->sdata, ONE, ark_mem->tempv2, f);
    } else if (step_mem->implicit) {                   /* implicit */
      N_VScale(ONE, step_mem->sdata, f);
    } else {                                           /* explicit */
      N_VScale(ONE, ark_mem->tempv2, f);
    }

    break;

  default:
    /* return with RHS failure if unknown mode is passed */
    arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::ARKStep",
                    "arkStep_FullRHS", "Unknown full RHS mode");
    return(ARK_RHSFUNC_FAIL);
  }

  /* if M != I, then update f = M^{-1}*f */
  if (step_mem->mass_type != MASS_IDENTITY) {
    retval = step_mem->msolve((void *) ark_mem, f,
                              step_mem->nlscoef/ark_mem->h);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_MASSSOLVE_FAIL, "ARKode::ARKStep",
                      "arkStep_FullRHS", "Mass matrix solver failure");
      return(ARK_MASSSOLVE_FAIL);
    }
  }

  return(ARK_SUCCESS);
}